

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O1

void __thiscall
cppcms::impl::buddy_allocator::buddy_allocator(buddy_allocator *this,size_t memory_size)

{
  void *pvVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  buddy_allocator *pbVar7;
  ulong uVar8;
  long lVar9;
  buddy_allocator *pbVar10;
  bool bVar11;
  
  uVar6 = memory_size - 0x220;
  this->memory_size_ = uVar6;
  this->max_bit_size_ = -1;
  pvVar3 = memset(this,0,0x200);
  pbVar7 = this + 1;
  iVar5 = -1;
  do {
    pvVar4 = (void *)0x3e;
    do {
      uVar8 = 2L << ((byte)pvVar4 & 0x3f);
      bVar11 = uVar8 >> 1 <= uVar6;
      pvVar1 = pvVar4;
      if (uVar6 >= uVar8 || !bVar11) {
        pvVar1 = pvVar3;
      }
      pvVar3 = (void *)((ulong)pvVar1 & 0xffffffff);
      if (uVar6 < uVar8 && bVar11) goto LAB_00103b47;
      bVar11 = (void *)0x1 < pvVar4;
      pvVar4 = (void *)((long)pvVar4 + -1);
    } while (bVar11);
    pvVar3 = (void *)0xffffffff;
LAB_00103b47:
    iVar2 = (int)pvVar3;
    if (4 < iVar2) {
      lVar9 = 1L << ((byte)pvVar3 & 0x3f);
      uVar6 = uVar6 - lVar9;
      pbVar10 = (buddy_allocator *)((long)pbVar7->free_list_ + lVar9);
      *(int *)pbVar7->free_list_ = iVar2;
      pbVar7->free_list_[1] = (page *)0x0;
      pbVar7->free_list_[2] = (page *)0x0;
      this->free_list_[(long)pvVar3] = (page *)pbVar7;
      pbVar7 = pbVar10;
      if (iVar5 == -1) {
        this->max_bit_size_ = iVar2;
        iVar5 = iVar2;
      }
    }
    if (iVar2 < 5) {
      return;
    }
  } while( true );
}

Assistant:

buddy_allocator(size_t memory_size)
	{
		assert(sizeof(*this) <= memory_size);
		assert(sizeof(page) <= alignment * 2);
		assert(sizeof(*this) % alignment == 0);
		memory_size_ = memory_size - sizeof(*this);
		max_bit_size_ = -1;
		memset(free_list_,0,sizeof(free_list_));
		LOG("Usable memory %zd",memory_size_);
		char *pos = memory();
		size_t reminder = memory_size_;
		for(;;) {
			int bits = containts_bits(reminder);
			if(bits < alignment_bits + 1)
				break;
			size_t page_size = size_t(1) << bits;
			page *p=reinterpret_cast<page *>(pos);
			reminder -= page_size;
			LOG("Added chunk of size %zd (%d) at pos %zx reminder %zd",page_size,bits,pos - memory(),reminder);
			pos+= page_size;
			p->bits = bits;
			p->prev = 0;
			p->next = 0;
			free_list_[bits] = p;
			if(max_bit_size_ == -1)
				max_bit_size_ = bits;
		}
	}